

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTwoDirectionRepeatFactor::IfcTwoDirectionRepeatFactor
          (IfcTwoDirectionRepeatFactor *this)

{
  *(undefined ***)&this->field_0x50 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(char **)&this->field_0x60 = "IfcTwoDirectionRepeatFactor";
  IfcOneDirectionRepeatFactor::IfcOneDirectionRepeatFactor
            (&this->super_IfcOneDirectionRepeatFactor,&PTR_construction_vtable_24__0081d0f0);
  *(undefined8 *)&(this->super_IfcOneDirectionRepeatFactor).field_0x40 = 0;
  *(undefined8 *)&(this->super_IfcOneDirectionRepeatFactor).field_0x48 = 0;
  (this->super_IfcOneDirectionRepeatFactor).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x81d038;
  *(undefined8 *)&this->field_0x50 = 0x81d0d8;
  *(undefined8 *)
   &(this->super_IfcOneDirectionRepeatFactor).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x81d060;
  *(undefined8 *)
   &(this->super_IfcOneDirectionRepeatFactor).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x81d088;
  *(undefined8 *)&(this->super_IfcOneDirectionRepeatFactor).field_0x38 = 0x81d0b0;
  return;
}

Assistant:

IfcTwoDirectionRepeatFactor() : Object("IfcTwoDirectionRepeatFactor") {}